

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::~InstancedRenderingCase
          (InstancedRenderingCase *this)

{
  pointer pVVar1;
  pointer pfVar2;
  pointer puVar3;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstancedRenderingCase_02138728;
  deinit(this);
  pVVar1 = (this->m_instanceColorB).
           super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_instanceColorB).
                                 super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pVVar1 = (this->m_instanceColorG).
           super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_instanceColorG).
                                 super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pVVar1 = (this->m_instanceColorR).
           super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->m_instanceColorR).
                                 super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
  }
  pfVar2 = (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2,(long)(this->m_instanceOffsets).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar2);
  }
  puVar3 = (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->m_gridIndices).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  pfVar2 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2,(long)(this->m_gridVertexPositions).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar2);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

InstancedRenderingCase::~InstancedRenderingCase (void)
{
	InstancedRenderingCase::deinit();
}